

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.cpp
# Opt level: O0

void baryonyx::context_set_solver_parameters(context_ptr *ctx,solver_parameters *params)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  pre_constraint_order pVar4;
  constraint_order cVar5;
  floating_point_type fVar6;
  init_policy_type iVar7;
  cost_norm_type cVar8;
  mode_type mVar9;
  preprocessor_options pVar10;
  observer_type oVar11;
  storage_type sVar12;
  solver_type sVar13;
  bool bVar14;
  pointer pcVar15;
  double *pdVar16;
  undefined1 auVar17 [16];
  int local_18c;
  int local_184;
  long local_158;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double limit;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  solver_parameters *local_18;
  solver_parameters *params_local;
  context_ptr *ctx_local;
  
  local_18 = params;
  params_local = (solver_parameters *)ctx;
  if (0.0 < params->time_limit) {
    local_c0 = params->time_limit;
  }
  else {
    local_c0 = std::numeric_limits<double>::infinity();
  }
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).time_limit = local_c0;
  if ((0.0 <= local_18->theta) && (local_18->theta <= 1.0)) {
    dVar1 = local_18->theta;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).theta = dVar1;
  }
  if (((local_18->delta == -1.0) && (!NAN(local_18->delta))) || (0.0 <= local_18->delta)) {
    dVar1 = local_18->delta;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).delta = dVar1;
  }
  if ((((local_18->kappa_min < local_18->kappa_max) && (0.0 <= local_18->kappa_min)) &&
      ((local_18->kappa_min < 1.0 && ((local_18->kappa_max <= 1.0 && (0.0 <= local_18->kappa_step)))
       ))) && (local_18->kappa_step < 1.0)) {
    dVar1 = local_18->kappa_min;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).kappa_min = dVar1;
    dVar1 = local_18->kappa_step;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).kappa_step = dVar1;
    dVar1 = local_18->kappa_max;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).kappa_max = dVar1;
  }
  if (0.0 <= local_18->alpha) {
    dVar1 = local_18->alpha;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).alpha = dVar1;
  }
  bVar14 = std::isfinite(local_18->pushing_k_factor);
  if (bVar14) {
    dVar1 = local_18->pushing_k_factor;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).pushing_k_factor = dVar1;
  }
  bVar14 = std::isfinite(local_18->pushing_objective_amplifier);
  if (bVar14) {
    dVar1 = local_18->pushing_objective_amplifier;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).pushing_objective_amplifier = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_crossover_bastert_insertion);
  if (bVar14) {
    local_20 = 0.0;
    local_28 = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_crossover_bastert_insertion,&local_20,&local_28);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_crossover_bastert_insertion = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_crossover_solution_selection_mean);
  if (bVar14) {
    local_30 = 0.0;
    local_38 = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_crossover_solution_selection_mean,&local_30,
                                 &local_38);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_crossover_solution_selection_mean = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_crossover_solution_selection_stddev);
  if (bVar14) {
    local_40 = 0.0;
    local_48 = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_crossover_solution_selection_stddev,&local_40,
                                 &local_48);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_crossover_solution_selection_stddev = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_mutation_variable_mean);
  if (bVar14) {
    local_50 = 0.0;
    local_58 = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_mutation_variable_mean,&local_50,&local_58);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_mutation_variable_mean = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_mutation_variable_stddev);
  if (bVar14) {
    local_60 = 0.0;
    local_68 = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_mutation_variable_stddev,&local_60,&local_68);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_mutation_variable_stddev = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_mutation_value_mean);
  if (bVar14) {
    local_70 = 0.0;
    local_78 = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_mutation_value_mean,&local_70,&local_78);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_mutation_value_mean = dVar1;
  }
  bVar14 = std::isfinite(local_18->init_mutation_value_stddev);
  if (bVar14) {
    local_80 = 0.0;
    limit = 1.0;
    pdVar16 = std::clamp<double>(&local_18->init_mutation_value_stddev,&local_80,&limit);
    dVar1 = *pdVar16;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_mutation_value_stddev = dVar1;
  }
  if ((0.0 <= local_18->init_policy_random) && (local_18->init_policy_random <= 1.0)) {
    dVar1 = local_18->init_policy_random;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_policy_random = dVar1;
  }
  uVar2 = local_18->seed;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).seed = uVar2;
  iVar3 = local_18->thread;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).thread = iVar3;
  if (local_18->limit < 1) {
    local_158 = std::numeric_limits<long>::max();
  }
  else {
    local_158 = local_18->limit;
  }
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).limit = local_158;
  if (-1 < local_18->print_level) {
    iVar3 = local_18->print_level;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).print_level = iVar3;
  }
  if (0.0 <= local_18->w) {
    if (local_18->limit < 1) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_18->w;
      auVar17 = vroundsd_avx((undefined1  [16])0x0,auVar17,9);
      pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                          ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                           params_local);
      (pcVar15->parameters).w = auVar17._0_8_;
    }
    else {
      local_90 = (double)local_18->limit;
      if (1.0 <= local_18->w) {
        pdVar16 = std::min<double>(&local_90,&local_18->w);
        dVar1 = *pdVar16;
        pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                            ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                             params_local);
        (pcVar15->parameters).w = dVar1;
      }
      else {
        dVar1 = local_90 * local_18->w;
        pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                            ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                             params_local);
        (pcVar15->parameters).w = dVar1;
      }
    }
  }
  else {
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).w = 0.0;
  }
  if (local_18->pushes_limit < 1) {
    local_184 = 0;
  }
  else {
    local_184 = local_18->pushes_limit;
  }
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).pushes_limit = local_184;
  if (local_18->pushing_iteration_limit < 1) {
    local_18c = 0;
  }
  else {
    local_18c = local_18->pushing_iteration_limit;
  }
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).pushing_iteration_limit = local_18c;
  if (4 < local_18->init_population_size) {
    iVar3 = local_18->init_population_size;
    pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                        ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)
                         params_local);
    (pcVar15->parameters).init_population_size = iVar3;
  }
  local_98 = 0.0;
  local_a0 = 1.0;
  pdVar16 = std::clamp<double>(&local_18->init_kappa_improve_start,&local_98,&local_a0);
  dVar1 = *pdVar16;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).init_kappa_improve_start = dVar1;
  local_a8 = 0.0;
  local_b0 = 1.0;
  pdVar16 = std::clamp<double>(&local_18->init_kappa_improve_increase,&local_a8,&local_b0);
  dVar1 = *pdVar16;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).init_kappa_improve_increase = dVar1;
  pdVar16 = &local_18->init_kappa_improve_stop;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  local_b8 = 1.0;
  pdVar16 = std::clamp<double>(pdVar16,&(pcVar15->parameters).init_kappa_improve_start,&local_b8);
  dVar1 = *pdVar16;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).init_kappa_improve_stop = dVar1;
  pVar4 = local_18->pre_order;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).pre_order = pVar4;
  cVar5 = local_18->order;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).order = cVar5;
  fVar6 = local_18->float_type;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).float_type = fVar6;
  iVar7 = local_18->init_policy;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).init_policy = iVar7;
  cVar8 = local_18->cost_norm;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).cost_norm = cVar8;
  mVar9 = local_18->mode;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).mode = mVar9;
  pVar10 = local_18->preprocessor;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).preprocessor = pVar10;
  oVar11 = local_18->observer;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).observer = oVar11;
  sVar12 = local_18->storage;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).storage = sVar12;
  sVar13 = local_18->solver;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).solver = sVar13;
  bVar14 = local_18->debug;
  pcVar15 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator->
                      ((unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)> *)params_local)
  ;
  (pcVar15->parameters).debug = (bool)(bVar14 & 1);
  return;
}

Assistant:

void
context_set_solver_parameters(const context_ptr& ctx,
                              const solver_parameters& params)
{
    ctx->parameters.time_limit = params.time_limit <= 0
                                   ? std::numeric_limits<double>::infinity()
                                   : params.time_limit;

    if (params.theta >= 0 && params.theta <= 1)
        ctx->parameters.theta = params.theta;

    if (params.delta == -1 || params.delta >= 0)
        ctx->parameters.delta = params.delta;

    if (params.kappa_min < params.kappa_max && params.kappa_min >= 0 &&
        params.kappa_min < 1 && params.kappa_max <= 1 &&
        params.kappa_step >= 0 && params.kappa_step < 1) {
        ctx->parameters.kappa_min = params.kappa_min;
        ctx->parameters.kappa_step = params.kappa_step;
        ctx->parameters.kappa_max = params.kappa_max;
    }

    if (params.alpha >= 0)
        ctx->parameters.alpha = params.alpha;

    if (std::isfinite(params.pushing_k_factor))
        ctx->parameters.pushing_k_factor = params.pushing_k_factor;

    if (std::isfinite(params.pushing_objective_amplifier))
        ctx->parameters.pushing_objective_amplifier =
          params.pushing_objective_amplifier;

    if (std::isfinite(params.init_crossover_bastert_insertion))
        ctx->parameters.init_crossover_bastert_insertion =
          std::clamp(params.init_crossover_bastert_insertion, 0.0, 1.0);

    if (std::isfinite(params.init_crossover_solution_selection_mean))
        ctx->parameters.init_crossover_solution_selection_mean =
          std::clamp(params.init_crossover_solution_selection_mean, 0.0, 1.0);

    if (std::isfinite(params.init_crossover_solution_selection_stddev))
        ctx->parameters.init_crossover_solution_selection_stddev = std::clamp(
          params.init_crossover_solution_selection_stddev, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_variable_mean))
        ctx->parameters.init_mutation_variable_mean =
          std::clamp(params.init_mutation_variable_mean, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_variable_stddev))
        ctx->parameters.init_mutation_variable_stddev =
          std::clamp(params.init_mutation_variable_stddev, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_value_mean))
        ctx->parameters.init_mutation_value_mean =
          std::clamp(params.init_mutation_value_mean, 0.0, 1.0);

    if (std::isfinite(params.init_mutation_value_stddev))
        ctx->parameters.init_mutation_value_stddev =
          std::clamp(params.init_mutation_value_stddev, 0.0, 1.0);

    if (params.init_policy_random >= 0 && params.init_policy_random <= 1)
        ctx->parameters.init_policy_random = params.init_policy_random;

    ctx->parameters.seed = params.seed;
    ctx->parameters.thread = params.thread;

    ctx->parameters.limit = (params.limit <= 0)
                              ? std::numeric_limits<long int>::max()
                              : params.limit;

    if (params.print_level >= 0)
        ctx->parameters.print_level = params.print_level;

    // Convert the value [0..1] into a percentage of loop or use directly the
    // number if the value.

    if (params.w < 0) {
        ctx->parameters.w = 0;
    } else {
        if (params.limit > 0) {
            auto limit = static_cast<double>(params.limit);

            if (params.w < 1)
                ctx->parameters.w = limit * params.w;
            else
                ctx->parameters.w = std::min(limit, params.w);
        } else {
            ctx->parameters.w = std::floor(params.w);
        }
    }

    ctx->parameters.pushes_limit =
      params.pushes_limit <= 0 ? 0 : params.pushes_limit;

    ctx->parameters.pushing_iteration_limit =
      params.pushing_iteration_limit <= 0 ? 0 : params.pushing_iteration_limit;

    if (params.init_population_size >= 5)
        ctx->parameters.init_population_size = params.init_population_size;

    ctx->parameters.init_kappa_improve_start =
      std::clamp(params.init_kappa_improve_start, 0.0, 1.0);

    ctx->parameters.init_kappa_improve_increase =
      std::clamp(params.init_kappa_improve_increase, 0.0, 1.0);

    ctx->parameters.init_kappa_improve_stop =
      std::clamp(params.init_kappa_improve_stop,
                 ctx->parameters.init_kappa_improve_start,
                 1.0);

    ctx->parameters.pre_order = params.pre_order;
    ctx->parameters.order = params.order;
    ctx->parameters.float_type = params.float_type;
    ctx->parameters.init_policy = params.init_policy;
    ctx->parameters.cost_norm = params.cost_norm;
    ctx->parameters.mode = params.mode;
    ctx->parameters.preprocessor = params.preprocessor;
    ctx->parameters.observer = params.observer;
    ctx->parameters.storage = params.storage;
    ctx->parameters.solver = params.solver;
    ctx->parameters.debug = params.debug;
}